

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O3

shared_ptr<slang::syntax::SyntaxTree> __thiscall
slang::syntax::SyntaxTree::fromLibraryMapBuffer
          (SyntaxTree *this,SourceBuffer *buffer,SourceManager *sourceManager,Bag *options)

{
  SyntaxTree *pSVar1;
  LibraryMapSyntax *root;
  SyntaxTree *this_00;
  ParserMetadata *metadata;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<slang::syntax::SyntaxTree> sVar2;
  BumpAllocator alloc;
  Diagnostics diagnostics;
  Preprocessor preprocessor;
  Parser parser;
  allocator<std::pair<const_std::type_index,_std::any>_> local_8b1;
  vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  local_8b0;
  SourceManager *local_898;
  SyntaxTree *local_890;
  BumpAllocator local_888;
  undefined8 local_878;
  undefined8 uStack_870;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  local_868;
  Diagnostics local_838;
  Preprocessor local_740;
  Parser local_3a8;
  
  local_890 = this;
  BumpAllocator::BumpAllocator(&local_888);
  local_838.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.data_
       = (pointer)local_838.super_SmallVector<slang::Diagnostic,_2UL>.
                  super_SmallVectorBase<slang::Diagnostic>.firstElement;
  local_838.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.len =
       0;
  local_838.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.cap =
       2;
  local_878 = 0;
  uStack_870 = 0;
  local_898 = sourceManager;
  parsing::Preprocessor::Preprocessor
            (&local_740,sourceManager,&local_888,&local_838,options,
             (span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>)
             ZEXT816(0));
  parsing::Preprocessor::pushSource(&local_740,*buffer);
  parsing::Parser::Parser(&local_3a8,&local_740,options);
  root = parsing::Parser::parseLibraryMap(&local_3a8);
  this_00 = (SyntaxTree *)operator_new(0x178);
  metadata = parsing::Parser::getMetadata(&local_3a8);
  parsing::Preprocessor::getDefinedMacros(&local_8b0,&local_740);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::table_core(&local_868,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                *)options,&local_8b1);
  SyntaxTree(this_00,&root->super_SyntaxNode,(SourceLibrary *)0x0,local_898,&local_888,&local_838,
             metadata,&local_8b0,(Bag *)&local_868);
  pSVar1 = local_890;
  *(SyntaxTree **)local_890 = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<slang::syntax::SyntaxTree*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_890->rootNode,this_00);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core(&local_868);
  if (local_8b0.
      super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    this_00 = (SyntaxTree *)
              ((long)local_8b0.
                     super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)local_8b0.
                    super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    operator_delete(local_8b0.
                    super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,(size_t)this_00);
  }
  parsing::Parser::~Parser(&local_3a8);
  parsing::Preprocessor::~Preprocessor(&local_740);
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&local_838,(EVP_PKEY_CTX *)this_00);
  BumpAllocator::~BumpAllocator(&local_888);
  sVar2.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pSVar1;
  return (shared_ptr<slang::syntax::SyntaxTree>)
         sVar2.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SyntaxTree> SyntaxTree::fromLibraryMapBuffer(const SourceBuffer& buffer,
                                                             SourceManager& sourceManager,
                                                             const Bag& options) {
    BumpAllocator alloc;
    Diagnostics diagnostics;
    Preprocessor preprocessor(sourceManager, alloc, diagnostics, options);
    preprocessor.pushSource(buffer);

    Parser parser(preprocessor, options);
    auto& root = parser.parseLibraryMap();

    return std::shared_ptr<SyntaxTree>(
        new SyntaxTree(&root, nullptr, sourceManager, std::move(alloc), std::move(diagnostics),
                       parser.getMetadata(), preprocessor.getDefinedMacros(), options));
}